

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O3

bool benchmark::ParseInt32Flag(char *str,char *flag,int32_t *value)

{
  bool bVar1;
  char *str_00;
  long *plVar2;
  size_type *psVar3;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar1 = false;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"The value of flag --","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar2[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    bVar1 = ParseInt32(&local_70,str_00,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(std::string("The value of flag --") + flag, value_str,
                    value);
}